

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_get_keyimage(secp256k1_context *ctx,uint8_t *ki,uint8_t *pk,uint8_t *sk)

{
  int iVar1;
  int overflow;
  size_t clen;
  secp256k1_scalar s;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  secp256k1_ge ge1;
  secp256k1_gej gej1;
  secp256k1_gej gej2;
  
  local_1a8 = (undefined1  [16])0x0;
  local_198 = (undefined1  [16])0x0;
  iVar1 = hash_to_curve(&ge1,pk,(size_t)pk);
  if (iVar1 == 0) {
    secp256k1_scalar_set_b32(&s,sk,&overflow);
    iVar1 = 2;
    if ((overflow == 0) && ((s.d[3] != 0 || s.d[1] != 0) || (s.d[2] != 0 || s.d[0] != 0))) {
      gej1.infinity = ge1.infinity;
      gej1.x.n[0] = ge1.x.n[0];
      gej1.x.n[1] = ge1.x.n[1];
      gej1.x.n[2] = ge1.x.n[2];
      gej1.x.n[3] = ge1.x.n[3];
      gej1.x.n[4] = ge1.x.n[4];
      gej1.y.n[0] = ge1.y.n[0];
      gej1.y.n[1] = ge1.y.n[1];
      gej1.y.n[2] = ge1.y.n[2];
      gej1.y.n[3] = ge1.y.n[3];
      gej1.y.n[4] = ge1.y.n[4];
      gej1.z.n[0] = 1;
      gej1.z.n[1] = 0;
      gej1.z.n[2] = 0;
      gej1.z.n[3] = 0;
      gej1.z.n[4] = 0;
      secp256k1_ecmult(&ctx->ecmult_ctx,&gej2,&gej1,&s,(secp256k1_scalar *)local_1a8);
      secp256k1_ge_set_gej(&ge1,&gej2);
      secp256k1_eckey_pubkey_serialize(&ge1,ki,&clen,1);
      iVar1 = (uint)(clen != 0x21) * 3;
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int secp256k1_get_keyimage(const secp256k1_context *ctx, uint8_t *ki, const uint8_t *pk, const uint8_t *sk)
{
    secp256k1_ge ge1;
    secp256k1_scalar s, zero;
    secp256k1_gej gej1, gej2;
    int overflow;
    size_t clen;

    secp256k1_scalar_set_int(&zero, 0);

    if (0 != hash_to_curve(&ge1, pk, 33)) { /* H(pk) */
        return 1;
    }

    secp256k1_scalar_set_b32(&s, sk, &overflow);
    if (overflow || secp256k1_scalar_is_zero(&s)) {
        return 2;
    }

    secp256k1_gej_set_ge(&gej1, &ge1);
    secp256k1_ecmult(&ctx->ecmult_ctx, &gej2, &gej1, &s, &zero);  /* gej2 = H(pk) * sk */
    secp256k1_ge_set_gej(&ge1, &gej2);
    secp256k1_eckey_pubkey_serialize(&ge1, ki, &clen, 1);

    return (clen == 33) ? 0 : 3;
}